

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O1

void __thiscall SubcommandProgram_HelpOrder_Test::TestBody(SubcommandProgram_HelpOrder_Test *this)

{
  input_t *piVar1;
  bool bVar2;
  long lVar3;
  AssertHelper AStack_78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_70[0].ptr_ = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"-h","");
  piVar1 = &(this->super_SubcommandProgram).super_TApp.args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_70,
             (string *)local_50);
  if (local_70[0].ptr_ != local_60) {
    operator_delete(local_70[0].ptr_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run((TApp *)this);
  }
  testing::Message::Message((Message *)local_70);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x211,
             "Expected: run() throws an exception of type CLI::CallForHelp.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_78,(Message *)local_70);
  testing::internal::AssertHelper::~AssertHelper(&AStack_78);
  if (((local_70[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_70[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_70[0].ptr_ + 8))();
  }
  local_70[0].ptr_ = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"start","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"-h","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_70,
             &stack0xffffffffffffffd0);
  lVar3 = 0;
  do {
    if (local_40 + lVar3 != *(undefined1 **)((long)local_50 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_50 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run((TApp *)this);
  }
  testing::Message::Message((Message *)local_70);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x214,
             "Expected: run() throws an exception of type CLI::CallForHelp.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_78,(Message *)local_70);
  testing::internal::AssertHelper::~AssertHelper(&AStack_78);
  if (((local_70[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_70[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_70[0].ptr_ + 8))();
  }
  local_70[0].ptr_ = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"-h","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"start","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_70,
             &stack0xffffffffffffffd0);
  lVar3 = 0;
  do {
    if (local_40 + lVar3 != *(undefined1 **)((long)local_50 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_50 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run((TApp *)this);
  }
  testing::Message::Message((Message *)local_70);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x217,
             "Expected: run() throws an exception of type CLI::CallForHelp.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_78,(Message *)local_70);
  testing::internal::AssertHelper::~AssertHelper(&AStack_78);
  if (((local_70[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_70[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_70[0].ptr_ + 8))();
  }
  return;
}

Assistant:

TEST_F(SubcommandProgram, HelpOrder) {

    args = {"-h"};
    EXPECT_THROW(run(), CLI::CallForHelp);

    args = {"start", "-h"};
    EXPECT_THROW(run(), CLI::CallForHelp);

    args = {"-h", "start"};
    EXPECT_THROW(run(), CLI::CallForHelp);
}